

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VkResult __thiscall
VmaBlockVector::Allocate
          (VmaBlockVector *this,VkDeviceSize size,VkDeviceSize alignment,
          VmaAllocationCreateInfo *createInfo,VmaSuballocationType suballocType,
          size_t allocationCount,VmaAllocation *pAllocations)

{
  bool bVar1;
  VkResult VVar2;
  VmaAllocation *pAllocation;
  size_t sVar3;
  VmaMutexLockWrite lock;
  VmaMutexLockWrite local_38;
  
  if (alignment < this->m_MinAllocationAlignment) {
    alignment = this->m_MinAllocationAlignment;
  }
  bVar1 = this->m_hAllocator->m_UseMutex;
  local_38.m_pMutex = (VmaRWMutex *)0x0;
  if (bVar1 != false) {
    local_38.m_pMutex = &this->m_Mutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)&this->m_Mutex);
  }
  pAllocation = pAllocations;
  for (sVar3 = 0; allocationCount != sVar3; sVar3 = sVar3 + 1) {
    VVar2 = AllocatePage(this,size,alignment,createInfo,suballocType,pAllocation);
    if (VVar2 != VK_SUCCESS) goto LAB_001a697a;
    pAllocation = pAllocation + 1;
  }
  VVar2 = VK_SUCCESS;
  sVar3 = allocationCount;
LAB_001a697a:
  VmaMutexLockWrite::~VmaMutexLockWrite(&local_38);
  if (VVar2 != VK_SUCCESS) {
    while (sVar3 = sVar3 - 1, sVar3 != 0xffffffffffffffff) {
      Free(this,pAllocations[sVar3]);
    }
    memset(pAllocations,0,allocationCount << 3);
  }
  return VVar2;
}

Assistant:

VkResult VmaBlockVector::Allocate(
    VkDeviceSize size,
    VkDeviceSize alignment,
    const VmaAllocationCreateInfo& createInfo,
    VmaSuballocationType suballocType,
    size_t allocationCount,
    VmaAllocation* pAllocations)
{
    size_t allocIndex;
    VkResult res = VK_SUCCESS;

    alignment = VMA_MAX(alignment, m_MinAllocationAlignment);

    if (IsCorruptionDetectionEnabled())
    {
        size = VmaAlignUp<VkDeviceSize>(size, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
        alignment = VmaAlignUp<VkDeviceSize>(alignment, sizeof(VMA_CORRUPTION_DETECTION_MAGIC_VALUE));
    }

    {
        VmaMutexLockWrite lock(m_Mutex, m_hAllocator->m_UseMutex);
        for (allocIndex = 0; allocIndex < allocationCount; ++allocIndex)
        {
            res = AllocatePage(
                size,
                alignment,
                createInfo,
                suballocType,
                pAllocations + allocIndex);
            if (res != VK_SUCCESS)
            {
                break;
            }
        }
    }

    if (res != VK_SUCCESS)
    {
        // Free all already created allocations.
        while (allocIndex--)
            Free(pAllocations[allocIndex]);
        memset(pAllocations, 0, sizeof(VmaAllocation) * allocationCount);
    }

    return res;
}